

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode Curl_setstropt(char **charp,char *s)

{
  char *pcVar1;
  CURLcode CVar2;
  
  (*Curl_cfree)(*charp);
  *charp = (char *)0x0;
  CVar2 = CURLE_OK;
  if (s != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(s);
    if (pcVar1 == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *charp = pcVar1;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_setstropt(char **charp, const char *s)
{
  /* Release the previous storage at `charp' and replace by a dynamic storage
     copy of `s'. Return CURLE_OK or CURLE_OUT_OF_MEMORY. */

  Curl_safefree(*charp);

  if(s) {
    char *str = strdup(s);

    if(!str)
      return CURLE_OUT_OF_MEMORY;

    *charp = str;
  }

  return CURLE_OK;
}